

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

parser_error parse_player_timed_resist(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  long *plVar3;
  char *name;
  
  plVar3 = (long *)parser_priv(p);
  name = parser_getsym(p,"elem");
  if (name == (char *)0x0) {
    wVar1 = L'\xffffffff';
  }
  else {
    wVar1 = proj_name_to_idx(name);
  }
  if (plVar3 != (long *)0x0) {
    if (*plVar3 == 0) {
      pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else if ((uint)wVar1 < 0x19) {
      *(wchar_t *)(*plVar3 + 0x68) = wVar1;
      pVar2 = PARSE_ERROR_NONE;
    }
    else {
      pVar2 = PARSE_ERROR_INVALID_VALUE;
    }
    return pVar2;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                ,0x15e,"enum parser_error parse_player_timed_resist(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_resist(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "elem");
	int idx = (name) ? proj_name_to_idx(name) : -1;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (idx < 0 || idx >= ELEM_MAX) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	ps->t->temp_resist = idx;
	return PARSE_ERROR_NONE;
}